

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_projection_lash_desc(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  projection *projection;
  char *desc;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"desc");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar2 + 0x30));
    pcVar1 = string_make(pcVar1);
    *(char **)((long)pvVar2 + 0x30) = pcVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_projection_lash_desc(struct parser *p) {
	const char *desc = parser_getstr(p, "desc");
	struct projection *projection = parser_priv(p);

	if (!projection) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(projection->lash_desc);
	projection->lash_desc = string_make(desc);
	return PARSE_ERROR_NONE;
}